

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>,void>
               (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                *container,ostream *os)

{
  size_type sVar1;
  const_reference piVar2;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *__range3;
  ulong uVar3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  sVar1 = (container->settings).table_size;
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      piVar2 = google::
               sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::get
                         ((container->groups).
                          super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar3 / 0x30,
                          (short)uVar3 + (short)(uVar3 / 0x30) * -0x30);
      if ((uVar3 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), uVar3 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        break;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      std::ostream::operator<<((ostream *)os,*piVar2);
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }